

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::check_parsing_result(YdiskRestClient *this,Json *json,string *err)

{
  bool bVar1;
  runtime_error *this_00;
  
  bVar1 = json11::Json::is_null(json);
  if ((!bVar1) && (err->_M_string_length == 0)) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error parsing json response");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void YdiskRestClient::check_parsing_result(Json json, std::string err)
{
    if(json.is_null() || !err.empty())
        throw std::runtime_error("Error parsing json response");
}